

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O0

bool verona::resolve_selector(Lookup *p,Node *n)

{
  pointer *this;
  bool bVar1;
  bool bVar2;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  Token *pTVar5;
  element_type *this_00;
  Location *pLVar6;
  const_pointer __first;
  const_pointer pvVar7;
  size_type sVar8;
  reference psVar9;
  char *pcVar10;
  Node *pNVar11;
  string_view sVar12;
  Token local_210;
  WFLookup local_208;
  shared_ptr<trieste::NodeDef> local_1e8;
  shared_ptr<trieste::NodeDef> local_1d8;
  Lookup local_1c8;
  byte local_179;
  Token local_178;
  WFLookup local_170;
  byte local_149;
  Token local_148;
  WFLookup local_140;
  Token local_120;
  reference local_118;
  shared_ptr<trieste::NodeDef> *def;
  iterator __end1;
  iterator __begin1;
  Nodes *__range1;
  Token local_e8;
  WFLookup local_e0;
  undefined1 local_c0 [8];
  string_view view;
  size_t arity;
  Nodes defs;
  undefined1 local_88 [8];
  WFLookup id;
  Token local_58;
  WFLookup local_50;
  Token local_30;
  Token hand;
  Node *n_local;
  Lookup *p_local;
  
  trieste::Token::Token(&hand,(TokenDef *)Selector);
  bVar1 = trieste::operator==(n,&hand);
  if (!bVar1) {
    __assert_fail("n == Selector",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                  ,0xeb,"bool verona::resolve_selector(Lookup &, Node)");
  }
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)p);
  if (bVar1) {
    trieste::Token::Token(&local_58,(TokenDef *)Ref);
    trieste::operator/(&local_50,n,&local_58);
    p_Var3 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             trieste::wf::detail::WFLookup::operator->(&local_50);
    peVar4 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var3);
    pTVar5 = trieste::NodeDef::type(peVar4);
    local_30.def = pTVar5->def;
    trieste::wf::detail::WFLookup::~WFLookup(&local_50);
    this = &defs.
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    trieste::Token::Token((Token *)this,(TokenDef *)Ident);
    trieste::operator/((WFLookup *)local_88,n,(Token *)this);
    peVar4 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p);
    p_Var3 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             trieste::wf::detail::WFLookup::operator->((WFLookup *)local_88);
    this_00 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var3);
    pLVar6 = trieste::NodeDef::location(this_00);
    trieste::NodeDef::lookdown((Nodes *)&arity,peVar4,pLVar6);
    view._M_str = (char *)0x0;
    trieste::Token::Token(&local_e8,(TokenDef *)Int);
    trieste::operator/(&local_e0,n,&local_e8);
    p_Var3 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             trieste::wf::detail::WFLookup::operator->(&local_e0);
    peVar4 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var3);
    pLVar6 = trieste::NodeDef::location(peVar4);
    sVar12 = trieste::Location::view(pLVar6);
    view._M_len = (size_t)sVar12._M_str;
    local_c0 = (undefined1  [8])sVar12._M_len;
    trieste::wf::detail::WFLookup::~WFLookup(&local_e0);
    __first = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_c0);
    pvVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_c0);
    sVar8 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_c0);
    ::std::from_chars<unsigned_long>(__first,pvVar7 + sVar8,(unsigned_long *)&view._M_str,10);
    __end1 = ::std::
             vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ::begin((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      *)&arity);
    def = (shared_ptr<trieste::NodeDef> *)
          ::std::
          vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ::end((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 *)&arity);
    while (bVar1 = __gnu_cxx::
                   operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                             (&__end1,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                       *)&def), ((bVar1 ^ 0xffU) & 1) != 0) {
      psVar9 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
               ::operator*(&__end1);
      local_149 = 0;
      local_179 = 0;
      local_118 = psVar9;
      trieste::Token::Token(&local_120,(TokenDef *)Function);
      bVar2 = trieste::operator==(psVar9,&local_120);
      psVar9 = local_118;
      bVar1 = false;
      if (bVar2) {
        trieste::Token::Token(&local_148,(TokenDef *)Ref);
        trieste::operator/(&local_140,psVar9,&local_148);
        local_149 = 1;
        pNVar11 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_140);
        bVar2 = trieste::operator==(pNVar11,&local_30);
        psVar9 = local_118;
        bVar1 = false;
        if (bVar2) {
          trieste::Token::Token(&local_178,(TokenDef *)Params);
          trieste::operator/(&local_170,psVar9,&local_178);
          local_179 = 1;
          p_Var3 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)trieste::wf::detail::WFLookup::operator->(&local_170);
          peVar4 = ::std::
                   __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var3);
          pcVar10 = (char *)trieste::NodeDef::size(peVar4);
          bVar1 = pcVar10 == view._M_str;
        }
      }
      if ((local_179 & 1) != 0) {
        trieste::wf::detail::WFLookup::~WFLookup(&local_170);
      }
      if ((local_149 & 1) != 0) {
        trieste::wf::detail::WFLookup::~WFLookup(&local_140);
      }
      if (bVar1) {
        ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_1d8,local_118);
        Lookup::make(&local_1c8,p,&local_1d8);
        Lookup::operator=(p,&local_1c8);
        Lookup::~Lookup(&local_1c8);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1d8);
        trieste::Token::Token(&local_210,(TokenDef *)TypeArgs);
        trieste::operator/(&local_208,n,&local_210);
        pNVar11 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_208);
        ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_1e8,pNVar11);
        apply_typeargs(p,&local_1e8);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_1e8);
        trieste::wf::detail::WFLookup::~WFLookup(&local_208);
        p_local._7_1_ = true;
        goto LAB_0016789c;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
      ::operator++(&__end1);
    }
    p_local._7_1_ = false;
LAB_0016789c:
    ::std::
    vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>::
    ~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             *)&arity);
    trieste::wf::detail::WFLookup::~WFLookup((WFLookup *)local_88);
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

static bool resolve_selector(Lookup& p, Node n)
  {
    assert(n == Selector);

    if (!p.def)
      return false;

    auto hand = (n / Ref)->type();
    auto id = n / Ident;
    auto defs = p.def->lookdown(id->location());

    size_t arity = 0;
    auto view = (n / Int)->location().view();
    std::from_chars(view.data(), view.data() + view.size(), arity);

    for (auto& def : defs)
    {
      if (
        (def == Function) && ((def / Ref) == hand) &&
        ((def / Params)->size() == arity))
      {
        p = p.make(def);
        apply_typeargs(p, n / TypeArgs);
        return true;
      }
    }

    return false;
  }